

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawBorder
          (QTextDocumentLayoutPrivate *this,QPainter *painter,QRectF *rect,qreal topMargin,
          qreal bottomMargin,qreal border,QBrush *brush,BorderStyle style)

{
  bool bVar1;
  bool bVar2;
  QBrush *in_RSI;
  long in_FS_OFFSET;
  qreal qVar3;
  double in_XMM2_Qa;
  int i;
  bool turn_off_antialiasing;
  BorderStyle cssStyle;
  QRectF clipped;
  BorderPaginator paginator;
  QBrush *in_stack_000002d0;
  BorderStyle in_stack_000002d8;
  Edge in_stack_000002dc;
  qreal in_stack_000002e0;
  qreal in_stack_000002e8;
  qreal in_stack_000002f0;
  qreal in_stack_000002f8;
  qreal in_stack_00000300;
  qreal in_stack_00000308;
  QPainter *in_stack_00000310;
  QBrush *in_stack_fffffffffffffe58;
  QBrush *in_stack_fffffffffffffe60;
  double in_stack_fffffffffffffe70;
  BorderPaginator *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  qreal in_stack_fffffffffffffe88;
  qreal in_stack_fffffffffffffe90;
  QRectF *in_stack_fffffffffffffe98;
  QTextDocument *in_stack_fffffffffffffea0;
  BorderPaginator *in_stack_fffffffffffffea8;
  int local_e0;
  QRectF local_78;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_58;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_54;
  undefined1 local_50 [8];
  int local_48;
  int local_44;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_50,&DAT_00bd1fd8,0x48);
  BorderPaginator::BorderPaginator
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (qreal)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_58.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QPainter::renderHints((QPainter *)in_stack_fffffffffffffe60);
  local_54.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QFlags<QPainter::RenderHint>::operator&
                 ((QFlags<QPainter::RenderHint> *)in_stack_fffffffffffffe60,
                  (RenderHint)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  bVar1 = QFlags<QPainter::RenderHint>::operator!((QFlags<QPainter::RenderHint> *)&local_54);
  QPainter::setRenderHint
            ((QPainter *)in_stack_fffffffffffffe60,
             (RenderHint)((ulong)in_stack_fffffffffffffe58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0));
  for (local_e0 = local_48; local_e0 <= local_44; local_e0 = local_e0 + 1) {
    local_78.xp = -NAN;
    local_78.yp = -NAN;
    local_78.w = -NAN;
    local_78.h = -NAN;
    BorderPaginator::clipRect
              (in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    bVar2 = QRectF::isValid(&local_78);
    if (bVar2) {
      in_stack_fffffffffffffe58 = in_RSI;
      in_stack_fffffffffffffe60 = (QBrush *)QRectF::left(&local_78);
      QRectF::top(&local_78);
      qVar3 = QRectF::left(&local_78);
      in_stack_fffffffffffffe70 = qVar3 + in_XMM2_Qa;
      qVar3 = QRectF::bottom(&local_78);
      in_stack_fffffffffffffe78 = (BorderPaginator *)(qVar3 + in_XMM2_Qa);
      QBrush::QBrush(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      qDrawEdge(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002f8,
                in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
                in_stack_000002d8,in_stack_000002d0);
      QBrush::~QBrush((QBrush *)0x7f978e);
      QRectF::left(&local_78);
      QRectF::top(&local_78);
      QRectF::right(&local_78);
      QRectF::top(&local_78);
      QBrush::QBrush(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      qDrawEdge(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002f8,
                in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
                in_stack_000002d8,in_stack_000002d0);
      QBrush::~QBrush((QBrush *)0x7f9865);
      QRectF::right(&local_78);
      QRectF::top(&local_78);
      QRectF::right(&local_78);
      QRectF::bottom(&local_78);
      QBrush::QBrush(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      qDrawEdge(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002f8,
                in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
                in_stack_000002d8,in_stack_000002d0);
      QBrush::~QBrush((QBrush *)0x7f9942);
      QRectF::left(&local_78);
      QRectF::bottom(&local_78);
      QRectF::right(&local_78);
      QRectF::bottom(&local_78);
      QBrush::QBrush(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      qDrawEdge(in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002f8,
                in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
                in_stack_000002d8,in_stack_000002d0);
      QBrush::~QBrush((QBrush *)0x7f9a40);
    }
  }
  if (bVar1) {
    QPainter::setRenderHint
              ((QPainter *)in_stack_fffffffffffffe60,
               (RenderHint)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawBorder(QPainter *painter, const QRectF &rect, qreal topMargin, qreal bottomMargin,
                                            qreal border, const QBrush &brush, QTextFrameFormat::BorderStyle style) const
{
    BorderPaginator paginator(document, rect, topMargin, bottomMargin, border);

#ifndef QT_NO_CSSPARSER
    QCss::BorderStyle cssStyle = static_cast<QCss::BorderStyle>(style + 1);
#else
    Q_UNUSED(style);
#endif //QT_NO_CSSPARSER

    bool turn_off_antialiasing = !(painter->renderHints() & QPainter::Antialiasing);
    painter->setRenderHint(QPainter::Antialiasing);

    for (int i = paginator.topPage; i <= paginator.bottomPage; ++i) {
        QRectF clipped = paginator.clipRect(i);
        if (!clipped.isValid())
            continue;

#ifndef QT_NO_CSSPARSER
        qDrawEdge(painter, clipped.left(), clipped.top(), clipped.left() + border, clipped.bottom() + border, 0, 0, QCss::LeftEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.left() + border, clipped.top(), clipped.right() + border, clipped.top() + border, 0, 0, QCss::TopEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.right(), clipped.top() + border, clipped.right() + border, clipped.bottom(), 0, 0, QCss::RightEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.left() + border, clipped.bottom(), clipped.right() + border, clipped.bottom() + border, 0, 0, QCss::BottomEdge, cssStyle, brush);
#else
        painter->save();
        painter->setPen(Qt::NoPen);
        painter->setBrush(brush);
        painter->drawRect(QRectF(clipped.left(), clipped.top(), clipped.left() + border, clipped.bottom() + border));
        painter->drawRect(QRectF(clipped.left() + border, clipped.top(), clipped.right() + border, clipped.top() + border));
        painter->drawRect(QRectF(clipped.right(), clipped.top() + border, clipped.right() + border, clipped.bottom()));
        painter->drawRect(QRectF(clipped.left() + border, clipped.bottom(), clipped.right() + border, clipped.bottom() + border));
        painter->restore();
#endif //QT_NO_CSSPARSER
    }
    if (turn_off_antialiasing)
        painter->setRenderHint(QPainter::Antialiasing, false);
}